

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O1

void lj_profile_interpreter(lua_State *L)

{
  global_State *g;
  int iVar1;
  byte bVar2;
  
  iVar1 = profile_state.samples;
  g = (global_State *)(L->glref).ptr64;
  bVar2 = g->hookmask & 0x7f;
  if ((g->hookmask & 0x20) == 0) {
    profile_state.samples = 0;
    g->hookmask = ' ';
    lj_dispatch_update(g);
    (*profile_state.cb)(profile_state.data,L,iVar1,profile_state.vmstate);
    bVar2 = bVar2 | g->hookmask & 0x80;
  }
  g->hookmask = bVar2;
  lj_dispatch_update(g);
  return;
}

Assistant:

void LJ_FASTCALL lj_profile_interpreter(lua_State *L)
{
  ProfileState *ps = &profile_state;
  global_State *g = G(L);
  uint8_t mask;
  profile_lock(ps);
  mask = (g->hookmask & ~HOOK_PROFILE);
  if (!(mask & HOOK_VMEVENT)) {
    int samples = ps->samples;
    ps->samples = 0;
    g->hookmask = HOOK_VMEVENT;
    lj_dispatch_update(g);
    profile_unlock(ps);
    ps->cb(ps->data, L, samples, ps->vmstate);  /* Invoke user callback. */
    profile_lock(ps);
    mask |= (g->hookmask & HOOK_PROFILE);
  }
  g->hookmask = mask;
  lj_dispatch_update(g);
  profile_unlock(ps);
}